

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

uint __thiscall
ON_OutlineFigure::GetFigureCurves
          (ON_OutlineFigure *this,double scale,bool b3d,
          ON_SimpleArray<ON_NurbsCurve_*> *figure_curves)

{
  ON_SimpleArray<ON_NurbsCurve_*> *this_00;
  bool bVar1;
  uint uVar2;
  ON__UINT32 OVar3;
  bool local_59;
  ON_NurbsCurve *local_50;
  ON_NurbsCurve *figures_segment;
  ON__UINT32 i;
  ON__UINT32 segment_start_dex;
  ON__UINT32 figure_end_dex;
  ON__UINT32 figure_start_dex;
  bool bApplyScale;
  ON_SimpleArray<ON_NurbsCurve_*> *pOStack_30;
  uint figure_curves_count0;
  ON_SimpleArray<ON_NurbsCurve_*> *figure_curves_local;
  double dStack_20;
  bool b3d_local;
  double scale_local;
  ON_OutlineFigure *this_local;
  
  pOStack_30 = figure_curves;
  figure_curves_local._7_1_ = b3d;
  dStack_20 = scale;
  scale_local = (double)this;
  bVar1 = Internal_HasValidEnds(this,false);
  if (bVar1) {
    figure_start_dex = ON_SimpleArray<ON_NurbsCurve_*>::UnsignedCount(pOStack_30);
    bVar1 = ON_IsValid(dStack_20);
    local_59 = false;
    if ((bVar1) && (local_59 = false, 0.0 < dStack_20)) {
      local_59 = 1e-05 < ABS(dStack_20 - 1.0);
    }
    figure_end_dex._3_1_ = local_59;
    if (local_59 == false) {
      dStack_20 = 1.0;
    }
    segment_start_dex = 0;
    uVar2 = ON_SimpleArray<ON_OutlineFigurePoint>::UnsignedCount(&this->m_points);
    this_00 = pOStack_30;
    i = uVar2 - 1;
    OVar3 = Internal_EstimateFigureSegmentCount(this);
    ON_SimpleArray<ON_NurbsCurve_*>::Reserve(this_00,(ulong)OVar3);
    figures_segment._4_4_ = 0;
    while (figures_segment._4_4_ < i) {
      figures_segment._0_4_ = 0;
      local_50 = Internal_GetFigureCurve
                           (this,i,figures_segment._4_4_,(ON__UINT32 *)&figures_segment,
                            (bool)(figure_curves_local._7_1_ & 1),(ON_NurbsCurve *)0x0);
      if ((uint)figures_segment <= figures_segment._4_4_) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                   ,0x55a,"","Failed to parse a figure segment.");
        break;
      }
      if (local_50 != (ON_NurbsCurve *)0x0) {
        if ((figure_end_dex._3_1_ & 1) != 0) {
          ON_Geometry::Scale((ON_Geometry *)local_50,dStack_20);
        }
        ON_SimpleArray<ON_NurbsCurve_*>::Append(pOStack_30,&local_50);
      }
      figures_segment._4_4_ = (uint)figures_segment;
    }
    uVar2 = ON_SimpleArray<ON_NurbsCurve_*>::UnsignedCount(pOStack_30);
    this_local._4_4_ = uVar2 - figure_start_dex;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_OutlineFigure::GetFigureCurves(
  double scale,
  bool b3d,
  ON_SimpleArray< ON_NurbsCurve* >& figure_curves
) const
{
  if (false == Internal_HasValidEnds(false))
    return 0;

  const unsigned int figure_curves_count0 = figure_curves.UnsignedCount();

  const bool bApplyScale = ON_IsValid(scale) && scale > 0.0 && fabs(scale - 1.0) > 1.0e-5;
  if (false == bApplyScale)
    scale = 1.0;

  const ON__UINT32 figure_start_dex = 0;
  const ON__UINT32 figure_end_dex = m_points.UnsignedCount() - 1;

  //const ON_OutlineFigurePoint figure_start = m_points[figure_start_dex];
  //const ON_OutlineFigurePoint figure_end = m_points[figure_end_dex];
    
  // Find the end of this figure curve and estimate its NURBS curve segment_count.
  //bool bClosedFigure
  //  = ON_OutlineFigurePoint::Type::EndFigureOpen != figure_end.m_point_type
  //  && figure_end.IsOnFigure()
  //  && figure_start.m_point == figure_end.m_point
  //  ;

  // estimate number of NURBS curve segments
  figure_curves.Reserve(Internal_EstimateFigureSegmentCount());

  // get NURBS curve segments
  ON__UINT32 segment_start_dex = figure_start_dex;
  while (segment_start_dex < figure_end_dex)
  {
    ON__UINT32 i = 0;
    ON_NurbsCurve* figures_segment = Internal_GetFigureCurve(
      figure_end_dex,
      segment_start_dex,
      &i,
      b3d,
      nullptr
    );

    if (i <= segment_start_dex)
    {
      ON_ERROR("Failed to parse a figure segment.");
      //bClosedFigure = false;
      break;
    }

    if (nullptr != figures_segment)
    {
      if (bApplyScale)
        figures_segment->Scale(scale);
      figure_curves.Append(figures_segment);
    }
    //else
    //{
    //  bClosedFigure = false;
    //}

    segment_start_dex = i;
  }

  return (figure_curves.UnsignedCount() - figure_curves_count0);
}